

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.cpp
# Opt level: O1

void __thiscall CaDiCaL::Internal::init_probehbr_lrat(Internal *this)

{
  size_type sVar1;
  size_type __new_size;
  long lVar2;
  
  if ((this->lrat == true) && ((this->opts).probehbr == 0)) {
    lVar2 = (long)this->max_var * 2;
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::resize(&this->probehbr_chains,lVar2 + 2);
    __new_size = lVar2 + 2;
    if (__new_size != 0) {
      lVar2 = 0;
      sVar1 = __new_size;
      do {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)((long)&(((this->probehbr_chains).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl.super__Vector_impl_data + lVar2),__new_size);
        lVar2 = lVar2 + 0x18;
        sVar1 = sVar1 - 1;
      } while (sVar1 != 0);
    }
  }
  return;
}

Assistant:

void Internal::init_probehbr_lrat () {
  if (!lrat || opts.probehbr)
    return;
  const size_t size = 2 * (1 + (size_t) max_var);
  probehbr_chains.resize (size);
  for (size_t i = 0; i < size; i++) {
    probehbr_chains[i].resize (size);
    // commented because not needed... should be empty already
    /*
    for (size_t j = 0; j < size; j++) {
      vector<uint64_t> empty;
      probehbr_chains[i][j] = empty;
    }
    */
  }
}